

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Encode(Aggregate_State_PDU *this,KDataStream *stream)

{
  KUINT16 p;
  ushort uVar1;
  pointer pAVar2;
  pointer pEVar3;
  pointer pSVar4;
  pointer pSVar5;
  pointer pKVar6;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_AggregateID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AggregateID,stream);
  KDataStream::Write(stream,this->m_ui8ForceID);
  KDataStream::Write(stream,this->m_ui8AggState);
  (*(this->m_AggregateType).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_AggregateType,stream)
  ;
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Formation);
  (*(this->m_AggregateMarking).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AggregateMarking,stream);
  (*(this->m_Dimensions).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Dimensions,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  (*(this->m_CtrOfMassLoc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_CtrOfMassLoc,stream);
  (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Vel,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumAggregates);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumEntities);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumSilentAggregateTypes);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumSilentEntityTypes);
  for (pAVar2 = (this->m_vAI).
                super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar2 != (this->m_vAI).
                super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
                ._M_impl.super__Vector_impl_data._M_finish; pAVar2 = pAVar2 + 1) {
    (*(pAVar2->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[5])(pAVar2);
  }
  for (pEVar3 = (this->m_vEI).
                super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar3 != (this->m_vEI).
                super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
                ._M_impl.super__Vector_impl_data._M_finish; pEVar3 = pEVar3 + 1) {
    (*(pEVar3->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[5])(pEVar3);
  }
  if (this->m_ui16NumberOfPaddingOctets != 0) {
    uVar1 = 0;
    do {
      KDataStream::Write(stream,'\0');
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_ui16NumberOfPaddingOctets);
  }
  for (pSVar4 = (this->m_vSASL).
                super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 != (this->m_vSASL).
                super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
    (*(pSVar4->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar4,stream);
  }
  for (pSVar5 = (this->m_vSESL).
                super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar5 != (this->m_vSESL).
                super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar5 = pSVar5 + 1) {
    (*(pSVar5->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar5,stream);
  }
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumVariableDatum);
  for (pKVar6 = (this->m_vVD).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pKVar6 != (this->m_vVD).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pKVar6 = pKVar6 + 1) {
    (*(pKVar6->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar6->m_pRef,stream);
  }
  return;
}

Assistant:

void Aggregate_State_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_AggregateID
           << m_ui8ForceID
           << m_ui8AggState
           << KDIS_STREAM m_AggregateType
           << m_ui32Formation
           << KDIS_STREAM m_AggregateMarking
           << KDIS_STREAM m_Dimensions
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_CtrOfMassLoc
           << KDIS_STREAM m_Vel
           << m_ui16NumAggregates
           << m_ui16NumEntities
           << m_ui16NumSilentAggregateTypes
           << m_ui16NumSilentEntityTypes;

    vector<AggregateIdentifier>::const_iterator citrAI = m_vAI.begin();
    for( ; citrAI != m_vAI.end(); ++citrAI )
    {
        citrAI->Encode( stream );
    }

    vector<EntityIdentifier>::const_iterator citrEI = m_vEI.begin();
    for( ; citrEI != m_vEI.end(); ++citrEI )
    {
        citrEI->Encode( stream );
    }

    if( needsPadding() )
    {
        const KUINT8 ui8Padding = 0;
        for( KUINT16 p = 0; p < m_ui16NumberOfPaddingOctets; ++p )
        {
            stream << ui8Padding;
        }
    }

    vector<SilentAggregateSystem>::const_iterator citrSAS = m_vSASL.begin();
    for( ; citrSAS != m_vSASL.end(); ++citrSAS )
    {
        citrSAS->Encode( stream );
    }

    vector<SilentEntitySystem>::const_iterator citrSES = m_vSESL.begin();
    for( ; citrSES != m_vSESL.end(); ++citrSES )
    {
        citrSES->Encode( stream );
    }

    stream << m_ui32NumVariableDatum;

    vector<VarDtmPtr>::const_iterator citrVD = m_vVD.begin();
    for( ; citrVD != m_vVD.end(); ++citrVD )
    {
        ( *citrVD )->Encode( stream );
    }
}